

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDecomposition.cpp
# Opt level: O0

void __thiscall
TreeDecomposition::updateNeighborSchema
          (TreeDecomposition *this,TDNode *node,size_t originID,size_t newAttrID)

{
  reference pvVar1;
  bitset<100UL> *in_RCX;
  TDNode *in_RDX;
  TreeDecomposition *in_RSI;
  TreeDecomposition *in_RDI;
  size_t c;
  size_t in_stack_ffffffffffffffc8;
  ulong __n;
  
  for (__n = 0; __n < in_RSI->_numOfEdges; __n = __n + 1) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &in_RSI->_attributes,__n);
    if ((TDNode *)*pvVar1 == in_RDX) {
      std::bitset<100UL>::set(in_RCX,__n,SUB81((ulong)in_RDI >> 0x38,0));
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&in_RSI->_attributes,__n);
      getRelation(in_RDI,in_stack_ffffffffffffffc8);
      updateNeighborSchema(in_RSI,in_RDX,(size_t)in_RCX,__n);
    }
  }
  return;
}

Assistant:

void TreeDecomposition::updateNeighborSchema(TDNode* node, size_t originID,
                                             size_t newAttrID)
{
    for (size_t c = 0; c < node->_numOfNeighbors; ++c)
    {        
        if (node->_neighbors[c] == originID)
            node->_neighborSchema[c].set(newAttrID);
        else
            updateNeighborSchema(getRelation(node->_neighbors[c]), node->_id, newAttrID);
    }
}